

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

msecnode_t * P_GetSecnode(void)

{
  msecnode_t *local_10;
  msecnode_t *node;
  
  if (headsecnode == (msecnode_t *)0x0) {
    local_10 = (msecnode_t *)
               M_Malloc_Dbg(0x38,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                            ,0x190b);
  }
  else {
    local_10 = headsecnode;
    headsecnode = headsecnode->m_snext;
  }
  return local_10;
}

Assistant:

msecnode_t *P_GetSecnode()
{
	msecnode_t *node;

	if (headsecnode)
	{
		node = headsecnode;
		headsecnode = headsecnode->m_snext;
	}
	else
	{
		node = (msecnode_t *)M_Malloc(sizeof(*node));
	}
	return node;
}